

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::call_expression::print(call_expression *this,wostream *os)

{
  bool bVar1;
  bool bVar2;
  wostream *pwVar3;
  syntax_node *psVar4;
  reference this_00;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *a;
  const_iterator __end2;
  const_iterator __begin2;
  expression_list *__range2;
  bool first;
  wostream *os_local;
  call_expression *this_local;
  
  pwVar3 = std::operator<<(os,"call_expression{");
  psVar4 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                      (&this->member_)->super_syntax_node;
  pwVar3 = mjs::operator<<(pwVar3,psVar4);
  std::operator<<(pwVar3,", {");
  bVar1 = true;
  __end2 = std::
           vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
           ::begin(&this->arguments_);
  a = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
      std::
      vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
      ::end(&this->arguments_);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_*,_std::vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>_>
                                *)&a);
    if (!bVar2) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_*,_std::vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>_>
              ::operator*(&__end2);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      std::operator<<(os,", ");
    }
    psVar4 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                        (this_00)->super_syntax_node;
    mjs::operator<<(os,psVar4);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_*,_std::vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>_>
    ::operator++(&__end2);
  }
  std::operator<<(os,"}}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "call_expression{" << *member_ << ", {";
        bool first = true;
        for (const auto& a: arguments_) {
            if (first) first = false;
            else os << ", ";
            os << *a;
        }
        os << "}}";
    }